

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-reconstruct.cc
# Opt level: O3

bool tinyusdz::prim::ReconstructShader<tinyusdz::UsdPrimvarReader<tinyusdz::value::vector3f>>
               (Specifier *spec,PropertyMap *properties,ReferenceList *references,
               UsdPrimvarReader_vector *preader,string *warn,string *err,
               PrimReconstructOptions *options)

{
  size_type *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  undefined8 uVar3;
  void *pvVar4;
  _Alloc_hider _Var5;
  size_type sVar6;
  size_type sVar7;
  undefined4 uVar8;
  undefined2 uVar9;
  undefined2 uVar10;
  undefined4 uVar11;
  undefined2 uVar12;
  undefined2 uVar13;
  bool bVar14;
  char cVar15;
  undefined1 uVar16;
  int iVar17;
  char *pcVar18;
  ostream *poVar19;
  long *plVar20;
  const_iterator cVar21;
  long *plVar22;
  mapped_type *pmVar23;
  _Base_ptr p_Var24;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar25;
  Property *args;
  size_type __n;
  ulong __n_00;
  _Base_ptr p_Var26;
  string *__v;
  Property *args_2;
  size_t i;
  ulong uVar27;
  long lVar28;
  ParseResult ret;
  string attr_type_name;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  table;
  optional<tinyusdz::value::vector3f> pv;
  ostringstream ss_e_1;
  stringstream ss;
  TypedAttribute<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffa08;
  string local_5e8;
  undefined1 local_5c8 [8];
  _Alloc_hider local_5c0;
  undefined1 local_5b8 [24];
  undefined1 local_5a0 [16];
  undefined1 local_590 [32];
  Property *local_570;
  key_type local_568;
  UsdPrimvarReader_vector *local_548;
  AttrMetas *local_540;
  AttrMetas *local_538;
  Property *local_530;
  string *local_528;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_520;
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  local_500 [8];
  _Rb_tree_node_base local_4f8;
  undefined8 local_4d8;
  optional<tinyusdz::value::vector3f> local_4d0;
  undefined1 local_4c0 [8];
  undefined4 local_4b8;
  char acStack_4b4 [4];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4b0;
  undefined1 local_4a0;
  undefined7 uStack_49f;
  undefined1 local_498;
  ios_base local_450 [280];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
  *local_338;
  undefined1 local_330 [32];
  long local_310 [2];
  optional<tinyusdz::value::vector3f> local_300;
  string local_2f0 [16];
  undefined8 local_2e0 [2];
  undefined1 local_2d0 [32];
  undefined1 local_2b0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2a0;
  Variability VStack_290;
  undefined4 uStack_28c;
  _Alloc_hider _Stack_288;
  undefined1 local_280 [24];
  storage_union sStack_268;
  vtable_type *local_258;
  _Base_ptr p_Stack_250;
  pointer local_248;
  pointer pSStack_240;
  pointer local_238;
  pointer pSStack_230;
  undefined1 local_228;
  pointer local_220;
  undefined1 local_218;
  optional<tinyusdz::Interpolation> local_210;
  optional<unsigned_int> oStack_208;
  size_type local_200;
  undefined1 auStack_1f8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8;
  undefined1 local_1c8;
  size_type local_1c0;
  undefined1 auStack_1b8 [48];
  _Alloc_hider local_188;
  storage_t<double> sStack_180;
  undefined1 local_178 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_158;
  storage_t<tinyusdz::Token> sStack_148;
  pointer local_128;
  storage_t<tinyusdz::Token> sStack_120;
  optional<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>_>
  local_100;
  undefined1 local_c8 [48];
  undefined1 auStack_98 [24];
  storage_t<tinyusdz::Animatable<tinyusdz::Token>_> local_80 [8];
  undefined1 auStack_78 [40];
  storage_t<tinyusdz::Token> sStack_50;
  
  local_4f8._M_left = &local_4f8;
  local_4f8._M_color = _S_red;
  local_4f8._M_parent = (_Base_ptr)0x0;
  local_4d8 = 0;
  args_2 = (Property *)err;
  local_528 = warn;
  local_4f8._M_right = local_4f8._M_left;
  local_2b0._0_8_ = &local_2a0;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2b0,"info:id","");
  ::std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            (local_500,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._0_8_ != &local_2a0) {
    operator_delete((void *)local_2b0._0_8_,
                    CONCAT26(local_2a0._M_allocated_capacity._6_2_,
                             CONCAT42(local_2a0._M_allocated_capacity._2_4_,
                                      local_2a0._M_allocated_capacity._0_2_)) + 1);
  }
  p_Var24 = (properties->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  local_330._8_8_ = &(properties->_M_t)._M_impl.super__Rb_tree_header;
  bVar14 = true;
  if (p_Var24 != (_Base_ptr)local_330._8_8_) {
    local_540 = &(preader->fallback)._metas;
    local_330._0_8_ = &(preader->fallback)._paths;
    local_450._272_8_ = &(preader->fallback)._attrib;
    local_530 = (Property *)&preader->varname;
    local_538 = &(preader->result)._metas;
    local_450._264_8_ = &(preader->result)._actual_type_name;
    local_338 = &(preader->super_ShaderNode).super_UsdShadePrim.props;
    local_548 = preader;
    do {
      local_520._M_dataplus._M_p = (pointer)&local_520.field_2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_520,*(long *)(p_Var24 + 1),
                 (long)&(p_Var24[1]._M_parent)->_M_color + *(long *)(p_Var24 + 1));
      local_570 = (Property *)(p_Var24 + 2);
      local_5e8._M_dataplus._M_p = (pointer)&local_5e8.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_5e8,"inputs:fallback","");
      sVar7 = local_520._M_string_length;
      sVar6 = local_5e8._M_string_length;
      local_5c0._M_p = local_5b8 + 8;
      local_5b8._0_8_ = (char *)0x0;
      local_5b8._8_8_ = local_5b8._8_8_ & 0xffffffffffffff00;
      __n = local_520._M_string_length;
      if (local_5e8._M_string_length < local_520._M_string_length) {
        __n = local_5e8._M_string_length;
      }
      if (__n == 0) {
        if (local_520._M_string_length == local_5e8._M_string_length) goto LAB_0023bfde;
LAB_0023c173:
        local_5c8._0_4_ = 1;
      }
      else {
        iVar17 = bcmp(local_520._M_dataplus._M_p,local_5e8._M_dataplus._M_p,__n);
        if ((sVar7 != sVar6) || (iVar17 != 0)) goto LAB_0023c173;
LAB_0023bfde:
        uVar13 = local_4c0._6_2_;
        uVar12 = local_4c0._4_2_;
        uVar11 = local_4c0._0_4_;
        local_4c0._4_2_ = (undefined2)((ulong)&local_4b0 >> 0x20);
        uVar9 = local_4c0._4_2_;
        local_4c0._6_2_ = (undefined2)((ulong)&local_4b0 >> 0x30);
        uVar10 = local_4c0._6_2_;
        local_4c0._0_4_ = SUB84(&local_4b0,0);
        uVar8 = local_4c0._0_4_;
        if (((ulong)p_Var24[0x17]._M_parent & 0xfffffffe00000000) == 0x200000000) {
          local_5c8._0_4_ = 7;
          local_5a0._0_8_ = &DAT_0000003e;
          pcVar18 = (char *)::std::__cxx11::string::_M_create((ulong *)local_4c0,(ulong)local_5a0);
          local_4c0._0_4_ = SUB84(pcVar18,0);
          local_4c0._4_2_ = (undefined2)((ulong)pcVar18 >> 0x20);
          local_4c0._6_2_ = (undefined2)((ulong)pcVar18 >> 0x30);
          local_4b0._M_allocated_capacity = local_5a0._0_8_;
          builtin_strncpy(pcVar18,"Property `{}` must be Attribute, but declared as Relationship.",
                          0x3e);
          local_4b8 = (undefined4)local_5a0._0_8_;
          acStack_4b4._0_2_ = SUB82(local_5a0._0_8_,4);
          acStack_4b4._2_2_ = SUB82(local_5a0._0_8_,6);
          pcVar18[local_5a0._0_8_] = '\0';
          fmt::format<std::__cxx11::string>
                    ((string *)local_2b0,(fmt *)local_4c0,&local_5e8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_5a0._0_8_);
          ::std::__cxx11::string::operator=((string *)&local_5c0,(string *)local_2b0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b0._0_8_ != &local_2a0) {
            operator_delete((void *)local_2b0._0_8_,
                            CONCAT26(local_2a0._M_allocated_capacity._6_2_,
                                     CONCAT42(local_2a0._M_allocated_capacity._2_4_,
                                              local_2a0._M_allocated_capacity._0_2_)) + 1);
          }
          paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)CONCAT26(local_4c0._6_2_,CONCAT24(local_4c0._4_2_,local_4c0._0_4_));
          uVar11 = local_4c0._0_4_;
          uVar12 = local_4c0._4_2_;
          uVar13 = local_4c0._6_2_;
          if (paVar2 != &local_4b0) {
            operator_delete(paVar2,(ulong)(local_4b0._M_allocated_capacity + 1));
            uVar11 = local_4c0._0_4_;
            uVar12 = local_4c0._4_2_;
            uVar13 = local_4c0._6_2_;
          }
        }
        local_4c0._6_2_ = uVar13;
        local_4c0._4_2_ = uVar12;
        local_4c0._0_4_ = uVar11;
        if (p_Var24[6]._M_left != p_Var24[6]._M_parent) {
          std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                    ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_330._0_8_,
                     (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                     &p_Var24[6]._M_parent);
          local_5c8 = (undefined1  [8])((ulong)local_5c8 & 0xffffffff00000000);
        }
        Attribute::type_name_abi_cxx11_((string *)local_5a0,&local_570->_attrib);
        local_2b0._0_8_ = &local_2a0;
        local_2a0._M_allocated_capacity._0_2_ = 0x6576;
        local_2a0._M_allocated_capacity._2_4_ = 0x726f7463;
        local_2a0._M_allocated_capacity._6_2_ = 0x6633;
        local_2b0._8_4_ = 8;
        local_2b0._12_2_ = 0;
        local_2b0._14_2_ = 0;
        local_2a0._8_4_ = local_2a0._8_4_ & 0xffffff00;
        if ((pointer)local_5a0._8_8_ == (pointer)0x8) {
          if (*(long *)local_5a0._0_8_ != 0x6633726f74636576) goto LAB_0023c1dd;
LAB_0023c534:
          iVar17 = *(int *)((long)&p_Var24[0x17]._M_parent + 4);
          if (iVar17 == 1) {
            if (p_Var24[5]._M_left == p_Var24[5]._M_parent) {
              if (p_Var24[4]._M_right == (_Base_ptr)0x0) {
                bVar14 = false;
              }
              else {
                iVar17 = (**(code **)p_Var24[4]._M_right)();
                bVar14 = iVar17 == 4;
              }
              uVar16 = (undefined1)p_Var24[5]._M_color;
              if ((bVar14) || ((uVar16 & _S_black) != _S_red)) {
                (local_548->fallback)._blocked = true;
              }
            }
            else {
              uVar16 = (undefined1)p_Var24[5]._M_color;
            }
            if (((((uVar16 & _S_black) == _S_red) && (p_Var24[4]._M_right != (_Base_ptr)0x0)) &&
                ((iVar17 = (**(code **)p_Var24[4]._M_right)(), iVar17 == 0 ||
                 ((p_Var24[4]._M_right != (_Base_ptr)0x0 &&
                  (iVar17 = (**(code **)p_Var24[4]._M_right)(), iVar17 == 1)))))) &&
               (p_Var24[5]._M_left == p_Var24[5]._M_parent)) {
              if (p_Var24[6]._M_left != p_Var24[6]._M_parent) {
                AttrMetas::operator=(local_540,(AttrMetas *)(p_Var24 + 7));
                __v = (string *)&local_520;
                goto LAB_0023c57c;
              }
            }
            else {
              local_4a0 = Varying;
              uStack_49f = 0;
              local_498 = 0;
              local_4b0._M_allocated_capacity = 0;
              local_4b0._8_4_ = Varying;
              local_4b0._12_4_ = 0;
              local_4b8._0_1_ = '\0';
              local_4b8._1_1_ = '\0';
              local_4b8._2_1_ = '\0';
              local_4b8._3_1_ = '\0';
              acStack_4b4[0] = '\0';
              acStack_4b4[1] = '\0';
              local_4c0._0_4_ = 0;
              local_4c0._4_2_ = 0;
              local_4c0._6_2_ = 0;
              bVar14 = primvar::PrimVar::is_valid((PrimVar *)&p_Var24[4]._M_parent);
              if (bVar14) {
                if ((((char)p_Var24[5]._M_color == _S_red) &&
                    (p_Var24[4]._M_right != (_Base_ptr)0x0)) &&
                   ((iVar17 = (**(code **)p_Var24[4]._M_right)(), iVar17 == 0 ||
                    ((p_Var24[4]._M_right != (_Base_ptr)0x0 &&
                     (iVar17 = (**(code **)p_Var24[4]._M_right)(), iVar17 == 1)))))) {
                  cVar15 = '\0';
                }
                else {
                  primvar::PrimVar::get_value<tinyusdz::value::vector3f>
                            (&local_4d0,(PrimVar *)&p_Var24[4]._M_parent);
                  cVar15 = local_4d0.has_value_;
                  if (local_4d0.has_value_ != false) {
                    local_300.contained._7_4_ = local_4d0.contained._8_4_;
                    local_300._3_1_ = SUB81(local_4d0.contained._0_8_,0);
                    local_300.contained._0_7_ = (undefined7)((ulong)local_4d0.contained._0_8_ >> 8);
                    local_4c0._0_4_ = (undefined4)local_4d0.contained._0_8_;
                    local_4c0._4_2_ = (undefined2)((ulong)local_4d0.contained._0_8_ >> 0x20);
                    local_4c0._6_2_ = (undefined2)((ulong)local_4d0.contained._0_8_ >> 0x30);
                    local_4b8._0_1_ = local_4d0.contained._8_1_;
                    local_4b8._1_1_ = local_4d0.contained._9_1_;
                    local_4b8._2_1_ = local_4d0.contained._10_1_;
                    local_4b8._3_1_ = local_4d0.contained._11_1_;
                    acStack_4b4[0] = '\x01';
                    acStack_4b4[1] = '\0';
                  }
                }
                p_Var26 = p_Var24[5]._M_parent;
                if (p_Var24[5]._M_left == p_Var26) {
                  if (cVar15 == '\0') goto LAB_0023d868;
                  local_2a0._8_4_ = 0;
                  local_2a0._12_4_ = 0;
                  VStack_290 = Varying;
                  uStack_28c = 0;
                  uVar16 = 0;
                  _Stack_288._M_p = (pointer)0x0;
                }
                else {
                  lVar28 = 0;
                  uVar27 = 0;
                  do {
                    if ((char)p_Var24[6]._M_color == _S_black) {
                      tinyusdz::value::TimeSamples::update((TimeSamples *)&p_Var24[5]._M_parent);
                      p_Var26 = p_Var24[5]._M_parent;
                    }
                    if (*(char *)((long)&p_Var26[1]._M_color + lVar28) == '\x01') {
                      TypedTimeSamples<tinyusdz::value::vector3f>::add_blocked_sample
                                ((TypedTimeSamples<tinyusdz::value::vector3f> *)&local_4b0,
                                 *(double *)((long)&p_Var26->_M_color + lVar28));
                    }
                    else {
                      tinyusdz::value::Value::get_value<tinyusdz::value::vector3f>
                                (&local_300,(Value *)((long)&p_Var26->_M_parent + lVar28),false);
                      local_4d0.has_value_ = local_300.has_value_;
                      if (local_300.has_value_ != true) {
                        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_4b0._M_allocated_capacity !=
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                           ) {
                          operator_delete((void *)local_4b0._M_allocated_capacity,
                                          CONCAT71(uStack_49f,local_4a0) - local_4b0._0_8_);
                        }
                        goto LAB_0023d868;
                      }
                      local_4d0.contained._11_1_ = local_300.contained._11_1_;
                      local_4d0.contained._8_3_ = local_300.contained._8_3_;
                      local_4d0.contained._0_8_ =
                           CONCAT17(local_300.contained._7_1_,local_300.contained._0_7_);
                      TypedTimeSamples<tinyusdz::value::vector3f>::add_sample
                                ((TypedTimeSamples<tinyusdz::value::vector3f> *)&local_4b0,
                                 *(double *)((long)&p_Var26->_M_color + lVar28),
                                 (vector3f *)&local_4d0.contained);
                    }
                    uVar27 = uVar27 + 1;
                    p_Var26 = p_Var24[5]._M_parent;
                    lVar28 = lVar28 + 0x28;
                  } while (uVar27 < (ulong)(((long)p_Var24[5]._M_left - (long)p_Var26 >> 3) *
                                           -0x3333333333333333));
                  _Stack_288._M_p = (pointer)CONCAT71(uStack_49f,local_4a0);
                  local_2a0._8_4_ = local_4b0._M_allocated_capacity._0_4_;
                  local_2a0._12_4_ = local_4b0._M_allocated_capacity._4_4_;
                  VStack_290 = local_4b0._8_4_;
                  uStack_28c = local_4b0._12_4_;
                  uVar16 = local_498;
                }
                uVar3 = CONCAT26(acStack_4b4._0_2_,CONCAT42(local_4b8,local_4c0._6_2_));
                local_568._M_string_length._7_1_ = (char)local_4b8;
                local_568.field_2._M_allocated_capacity._0_5_ = (undefined5)((ulong)uVar3 >> 0x18);
                local_568._M_dataplus._M_p._7_1_ = (undefined1)local_4c0._0_4_;
                local_568._M_string_length._0_5_ =
                     (undefined5)(CONCAT24(local_4c0._4_2_,local_4c0._0_4_) >> 8);
                local_568._M_string_length._5_2_ = local_4c0._6_2_;
                local_2b0[0] = 1;
                local_2a0._M_allocated_capacity._0_2_ =
                     (undefined2)
                     (CONCAT53(local_568.field_2._M_allocated_capacity._0_5_,
                               CONCAT12(local_568._M_string_length._7_1_,local_4c0._6_2_)) >> 0x10);
                local_2a0._M_allocated_capacity._2_4_ = (undefined4)((ulong)uVar3 >> 0x20);
                local_2b0._8_4_ = local_4c0._0_4_;
                local_2b0._12_2_ = local_4c0._4_2_;
                local_2b0._14_2_ = local_4c0._6_2_;
                local_280[0] = uVar16;
                nonstd::optional_lite::optional<tinyusdz::Animatable<tinyusdz::value::vector3f>>::
                operator=((optional<tinyusdz::Animatable<tinyusdz::value::vector3f>> *)
                          local_450._272_8_,(Animatable<tinyusdz::value::vector3f> *)(local_2b0 + 8)
                         );
                if (((local_2b0._0_8_ & 1) != 0) &&
                   (pvVar4 = (void *)CONCAT44(local_2a0._12_4_,local_2a0._8_4_),
                   pvVar4 != (void *)0x0)) {
                  operator_delete(pvVar4,(long)_Stack_288._M_p - (long)pvVar4);
                }
                AttrMetas::operator=(local_540,(AttrMetas *)(p_Var24 + 7));
                ::std::
                _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                ::_M_insert_unique<std::__cxx11::string_const&>
                          (local_500,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_5e8);
                local_5c8 = (undefined1  [8])((ulong)local_5c8 & 0xffffffff00000000);
              }
              else {
LAB_0023d868:
                local_5c8._0_4_ = 8;
                warn = (string *)0x55;
                ::std::__cxx11::string::_M_replace
                          ((ulong)&local_5c0,0,(char *)local_5b8._0_8_,0x3df346);
              }
            }
          }
          else if (iVar17 == 0) {
            (local_548->fallback)._value_empty = true;
            AttrMetas::operator=(local_540,(AttrMetas *)(p_Var24 + 7));
            __v = &local_5e8;
LAB_0023c57c:
            ::std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string_const&>
                      (local_500,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__v);
            local_5c8 = (undefined1  [8])((ulong)local_5c8 & 0xffffffff00000000);
          }
          else {
            warn = (string *)0x25;
            ::std::__cxx11::string::_M_replace((ulong)&local_5c0,0,(char *)local_5b8._0_8_,0x3df078)
            ;
            local_5c8._0_4_ = 8;
          }
        }
        else {
          local_4b8._0_1_ = '\x06';
          local_4b8._1_1_ = '\0';
          local_4b8._2_1_ = '\0';
          local_4b8._3_1_ = '\0';
          acStack_4b4[0] = '\0';
          acStack_4b4[1] = '\0';
          acStack_4b4[2] = '\0';
          acStack_4b4[3] = '\0';
          local_4b0._M_allocated_capacity._0_7_ = 0x3374616f6c66;
          local_4c0._0_4_ = uVar8;
          local_4c0._4_2_ = uVar9;
          local_4c0._6_2_ = uVar10;
          if (((pointer)local_5a0._8_8_ == (pointer)0x6) &&
             ((short)*(int *)(local_5a0._0_8_ + 4) == 0x3374 &&
              *(int *)local_5a0._0_8_ == 0x616f6c66)) goto LAB_0023c534;
LAB_0023c1dd:
          local_5c8._0_4_ = 3;
          ::std::__cxx11::stringstream::stringstream((stringstream *)local_2b0);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_2a0._M_local_buf,"Property type mismatch. ",0x18);
          poVar19 = ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_2a0._M_local_buf,local_5e8._M_dataplus._M_p,
                               local_5e8._M_string_length);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar19," expects type `",0xf);
          local_4b0._M_allocated_capacity = 0x6633726f74636576;
          local_4b8._0_1_ = '\b';
          local_4b8._1_1_ = '\0';
          local_4b8._2_1_ = '\0';
          local_4b8._3_1_ = '\0';
          acStack_4b4[0] = '\0';
          acStack_4b4[1] = '\0';
          acStack_4b4[2] = '\0';
          acStack_4b4[3] = '\0';
          local_4b0._8_4_ = local_4b0._8_4_ & 0xffffff00;
          local_4c0._0_4_ = uVar8;
          local_4c0._4_2_ = uVar9;
          local_4c0._6_2_ = uVar10;
          poVar19 = ::std::__ostream_insert<char,std::char_traits<char>>
                              (poVar19,local_4b0._M_local_buf,8);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    (poVar19,"` but defined as type `",0x17);
          poVar19 = ::std::__ostream_insert<char,std::char_traits<char>>
                              (poVar19,(char *)local_5a0._0_8_,local_5a0._8_8_);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar19,"`",1);
          paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)CONCAT26(local_4c0._6_2_,CONCAT24(local_4c0._4_2_,local_4c0._0_4_));
          if (paVar2 != &local_4b0) {
            operator_delete(paVar2,(ulong)(local_4b0._M_allocated_capacity + 1));
          }
          ::std::__cxx11::stringbuf::str();
          ::std::__cxx11::string::operator=((string *)&local_5c0,(string *)local_4c0);
          paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)CONCAT26(local_4c0._6_2_,CONCAT24(local_4c0._4_2_,local_4c0._0_4_));
          if (paVar2 != &local_4b0) {
            operator_delete(paVar2,(ulong)(local_4b0._M_allocated_capacity + 1));
          }
          ::std::__cxx11::stringstream::~stringstream((stringstream *)local_2b0);
          ::std::ios_base::~ios_base((ios_base *)&pSStack_230);
        }
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5a0._0_8_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_590) {
          operator_delete((void *)local_5a0._0_8_,(ulong)(local_590._0_8_ + 1));
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5e8._M_dataplus._M_p != &local_5e8.field_2) {
        operator_delete(local_5e8._M_dataplus._M_p,local_5e8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_520._M_dataplus._M_p != &local_520.field_2) {
        operator_delete(local_520._M_dataplus._M_p,local_520.field_2._M_allocated_capacity + 1);
      }
      iVar17 = 0;
      if (((ulong)local_5c8 & 0xfffffffd) == 0) {
        iVar17 = 3;
LAB_0023c618:
        bVar14 = false;
      }
      else {
        bVar14 = true;
        if (local_5c8._0_4_ != Unmatched) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2b0);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_2b0,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                     ,0x5a);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_2b0,"ReconstructShader",0x11);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,"():",3);
          poVar19 = (ostream *)::std::ostream::operator<<((Property *)local_2b0,0x1162);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar19," ",1);
          local_5a0._0_8_ =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_590;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_5a0,"Parsing attribute `{}` failed. Error: {}","");
          fmt::format<char[16],std::__cxx11::string>
                    ((string *)local_4c0,(fmt *)local_5a0,(string *)"inputs:fallback",
                     (char (*) [16])&local_5c0,warn);
          poVar19 = ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_2b0,
                               (char *)CONCAT26(local_4c0._6_2_,
                                                CONCAT24(local_4c0._4_2_,local_4c0._0_4_)),
                               CONCAT26(acStack_4b4._2_2_,CONCAT24(acStack_4b4._0_2_,local_4b8)));
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar19,"\n",1);
          paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)CONCAT26(local_4c0._6_2_,CONCAT24(local_4c0._4_2_,local_4c0._0_4_));
          if (paVar2 != &local_4b0) {
            operator_delete(paVar2,(ulong)(local_4b0._M_allocated_capacity + 1));
          }
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5a0._0_8_
              != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_590) {
            operator_delete((void *)local_5a0._0_8_,(ulong)(local_590._0_8_ + 1));
          }
          if (err != (string *)0x0) {
            ::std::__cxx11::stringbuf::str();
            plVar20 = (long *)::std::__cxx11::string::_M_append
                                        (local_5a0,(ulong)(err->_M_dataplus)._M_p);
            local_4c0._0_4_ = SUB84(&local_4b0,0);
            local_4c0._4_2_ = (undefined2)((ulong)&local_4b0 >> 0x20);
            local_4c0._6_2_ = (undefined2)((ulong)&local_4b0 >> 0x30);
            lVar28 = *plVar20;
            plVar22 = plVar20 + 2;
            if ((long *)lVar28 == plVar22) {
              local_4b0._M_allocated_capacity = *plVar22;
              local_4b0._8_4_ = (undefined4)plVar20[3];
              local_4b0._12_4_ = (undefined4)((ulong)plVar20[3] >> 0x20);
            }
            else {
              local_4c0._0_4_ = (undefined4)lVar28;
              local_4c0._4_2_ = (undefined2)((ulong)lVar28 >> 0x20);
              local_4c0._6_2_ = (undefined2)((ulong)lVar28 >> 0x30);
              local_4b0._M_allocated_capacity = *plVar22;
            }
            lVar28 = plVar20[1];
            local_4b8 = (undefined4)lVar28;
            acStack_4b4._0_2_ = (undefined2)((ulong)lVar28 >> 0x20);
            acStack_4b4._2_2_ = (undefined2)((ulong)lVar28 >> 0x30);
            *plVar20 = (long)plVar22;
            plVar20[1] = 0;
            *(undefined1 *)(plVar20 + 2) = 0;
            ::std::__cxx11::string::operator=((string *)err,(string *)local_4c0);
            paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)CONCAT26(local_4c0._6_2_,CONCAT24(local_4c0._4_2_,local_4c0._0_4_));
            if (paVar2 != &local_4b0) {
              operator_delete(paVar2,(ulong)(local_4b0._M_allocated_capacity + 1));
            }
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5a0._0_8_
                != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_590) {
              operator_delete((void *)local_5a0._0_8_,(ulong)(local_590._0_8_ + 1));
            }
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2b0);
          ::std::ios_base::~ios_base((ios_base *)&pSStack_240);
          iVar17 = 1;
          goto LAB_0023c618;
        }
      }
      if (local_5c0._M_p != local_5b8 + 8) {
        operator_delete(local_5c0._M_p,local_5b8._8_8_ + 1);
      }
      if (bVar14) {
        p_Var26 = p_Var24 + 1;
        iVar17 = ::std::__cxx11::string::compare((char *)p_Var26);
        if (iVar17 == 0) {
          local_2b0._0_8_ = &local_2a0;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2b0,"inputs:varname","")
          ;
          cVar21 = ::std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_500,(key_type *)local_2b0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b0._0_8_ != &local_2a0) {
            operator_delete((void *)local_2b0._0_8_,
                            CONCAT26(local_2a0._M_allocated_capacity._6_2_,
                                     CONCAT42(local_2a0._M_allocated_capacity._2_4_,
                                              local_2a0._M_allocated_capacity._0_2_)) + 1);
          }
          if (cVar21._M_node == &local_4f8) {
            local_2b0._0_8_ = ((ulong)local_2b0._0_8_ >> 8 & 0xffffff) << 8;
            local_2b0._8_4_ = local_2b0._8_4_ & 0xffffff00;
            local_2b0._12_2_ = 0;
            local_2b0._14_2_ = 0;
            local_2a0._M_allocated_capacity._0_2_ = 0;
            local_2a0._8_4_ = local_2a0._8_4_ & 0xffffff00;
            local_220 = (pointer)0x0;
            local_218 = ResetToExplicit;
            local_100.has_value_ = false;
            local_100._1_7_ = 0;
            local_100.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
            sStack_120._16_8_ = 0;
            sStack_120._24_8_ = 0;
            local_100.contained._16_4_ = 0;
            local_100.contained._24_8_ = 0;
            sStack_268._8_1_ = 0;
            local_280._16_8_ = 0;
            sStack_268.dynamic = (void *)0x0;
            local_280._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            local_280._8_8_ = 0;
            VStack_290 = Varying;
            uStack_28c._0_1_ = false;
            uStack_28c._1_3_ = 0;
            _Stack_288._M_p = (pointer)0x0;
            local_228 = 0;
            local_238 = (pointer)0x0;
            pSStack_230 = (pointer)0x0;
            local_248 = (pointer)0x0;
            pSStack_240 = (pointer)0x0;
            local_258 = (vtable_type *)0x0;
            p_Stack_250 = (_Base_ptr)0x0;
            auStack_1f8[8] = 0;
            local_200 = 0;
            auStack_1f8._0_8_ = 0;
            local_210.has_value_ = false;
            local_210._1_3_ = 0;
            local_210.contained = (storage_t<tinyusdz::Interpolation>)0x0;
            oStack_208.has_value_ = false;
            oStack_208._1_3_ = 0;
            oStack_208.contained = (storage_t<unsigned_int>)0x0;
            local_1c8 = 0;
            local_1d8._M_allocated_capacity = 0;
            local_1d8._8_8_ = 0;
            auStack_1f8._16_8_ = 0;
            auStack_1f8._24_8_ = 0;
            auStack_1b8[0x18] = 0;
            auStack_1b8._8_8_ = 0;
            auStack_1b8._16_8_ = 0;
            local_1c0 = 0;
            auStack_1b8._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            local_178[0x10] = 0;
            local_178._0_8_ = 0;
            local_178._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            local_188._M_p = (pointer)0x0;
            sStack_180 = (storage_t<double>)0x0;
            auStack_1b8._32_8_ = 0;
            auStack_1b8._40_8_ = 0;
            sStack_148._8_1_ = 0;
            aStack_158._8_8_ = 0;
            sStack_148.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
            local_178._24_8_ = 0;
            aStack_158._M_allocated_capacity = 0;
            sStack_120._8_1_ = 0;
            local_128 = (pointer)0x0;
            sStack_120.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
            sStack_148._16_8_ = 0;
            sStack_148._24_8_ = 0;
            local_100.contained._32_8_ = (long)&local_100.contained + 0x10;
            local_c8[0x20] = 0;
            local_c8._16_8_ = 0;
            local_c8._24_8_ = 0;
            local_c8._0_8_ = 0;
            local_c8._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            auStack_98[8] = 0;
            auStack_98._9_8_ = 0;
            local_c8._40_8_ = 0;
            auStack_98[0] = 0;
            auStack_98._1_7_ = 0;
            sStack_50._16_1_ = 0;
            sStack_50._17_8_ = 0;
            sStack_50.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
            sStack_50._8_1_ = _S_red;
            sStack_50._9_7_ = 0;
            auStack_78._24_8_ = 0;
            auStack_78._32_8_ = 0;
            auStack_78._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            auStack_78._16_8_ = 0;
            local_80[0] = (storage_t<tinyusdz::Animatable<tinyusdz::Token>_>)0x0;
            local_80[1] = (storage_t<tinyusdz::Animatable<tinyusdz::Token>_>)0x0;
            local_80[2] = (storage_t<tinyusdz::Animatable<tinyusdz::Token>_>)0x0;
            local_80[3] = (storage_t<tinyusdz::Animatable<tinyusdz::Token>_>)0x0;
            local_80[4] = (storage_t<tinyusdz::Animatable<tinyusdz::Token>_>)0x0;
            local_80[5] = (storage_t<tinyusdz::Animatable<tinyusdz::Token>_>)0x0;
            local_80[6] = (storage_t<tinyusdz::Animatable<tinyusdz::Token>_>)0x0;
            local_80[7] = (storage_t<tinyusdz::Animatable<tinyusdz::Token>_>)0x0;
            auStack_78._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            local_2d0._0_8_ = (long)local_2d0 + 0x10;
            local_590._24_8_ = p_Var26;
            local_100.contained._40_8_ = local_100.contained._32_8_;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)local_2d0,*(long *)(p_Var24 + 1),
                       (long)&(p_Var24[1]._M_parent)->_M_color + *(long *)(p_Var24 + 1));
            local_4c0._0_4_ = SUB84(&local_4b0,0);
            uVar11 = local_4c0._0_4_;
            local_4c0._4_2_ = (undefined2)((ulong)&local_4b0 >> 0x20);
            uVar12 = local_4c0._4_2_;
            local_4c0._6_2_ = (undefined2)((ulong)&local_4b0 >> 0x30);
            uVar9 = local_4c0._6_2_;
            warn = (string *)local_4c0;
            ::std::__cxx11::string::_M_construct<char_const*>((string *)warn,"inputs:varname","");
            args_2 = (Property *)local_2b0;
            anon_unknown_0::ParseTypedAttribute<tinyusdz::Token>
                      ((ParseResult *)local_5c8,
                       (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_500,(string *)local_2d0,local_570,warn,
                       (TypedAttribute<tinyusdz::Animatable<tinyusdz::Token>_> *)local_2b0);
            paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)CONCAT26(local_4c0._6_2_,CONCAT24(local_4c0._4_2_,local_4c0._0_4_));
            if (paVar2 != &local_4b0) {
              operator_delete(paVar2,(ulong)(local_4b0._M_allocated_capacity + 1));
            }
            if (local_2d0._0_8_ != (long)local_2d0 + 0x10) {
              operator_delete((void *)local_2d0._0_8_,local_2d0._16_8_ + 1);
            }
            p_Var26 = (_Base_ptr)local_590._24_8_;
            if (local_5c8._0_4_ == TypeMismatch) {
              local_2f0._0_8_ = local_2e0;
              ::std::__cxx11::string::_M_construct<char*>
                        (local_2f0,*(long *)(p_Var24 + 1),
                         (long)&(p_Var24[1]._M_parent)->_M_color + *(long *)(p_Var24 + 1));
              warn = (string *)local_4c0;
              local_4c0._0_4_ = uVar11;
              local_4c0._4_2_ = uVar12;
              local_4c0._6_2_ = uVar9;
              ::std::__cxx11::string::_M_construct<char_const*>((string *)warn,"inputs:varname","");
              args = local_570;
              args_2 = local_530;
              (anonymous_namespace)::ParseTypedAttribute<std::__cxx11::string>
                        ((ParseResult *)local_5a0,(_anonymous_namespace_ *)local_500,
                         (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_2f0,(string *)local_570,(Property *)warn,(string *)local_530,
                         in_stack_fffffffffffffa08);
              paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)CONCAT26(local_4c0._6_2_,CONCAT24(local_4c0._4_2_,local_4c0._0_4_));
              if (paVar2 != &local_4b0) {
                operator_delete(paVar2,(ulong)(local_4b0._M_allocated_capacity + 1));
              }
              if ((undefined8 *)local_2f0._0_8_ != local_2e0) {
                operator_delete((void *)local_2f0._0_8_,local_2e0[0] + 1);
              }
              if (local_5a0._0_4_ == Success) {
                iVar17 = 3;
                p_Var26 = (_Base_ptr)local_590._24_8_;
              }
              else {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4c0);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_4c0,"[error]",7);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_4c0,
                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                           ,0x5a);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c0,":",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_4c0,"ReconstructShader",0x11);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c0,"():",3);
                poVar19 = (ostream *)::std::ostream::operator<<((ostringstream *)local_4c0,0x117b);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar19," ",1);
                local_568._M_dataplus._M_p._0_7_ = SUB87(&local_568.field_2,0);
                local_568._M_dataplus._M_p._7_1_ = (undefined1)((ulong)&local_568.field_2 >> 0x38);
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_568,"Faied to parse inputs:varname: {}","");
                fmt::format<std::__cxx11::string>
                          (&local_5e8,(fmt *)&local_568,(string *)(local_5a0 + 8),
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args
                          );
                poVar19 = ::std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_4c0,local_5e8._M_dataplus._M_p,
                                     local_5e8._M_string_length);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar19,"\n",1);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_5e8._M_dataplus._M_p != &local_5e8.field_2) {
                  operator_delete(local_5e8._M_dataplus._M_p,
                                  local_5e8.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT17(local_568._M_dataplus._M_p._7_1_,local_568._M_dataplus._M_p._0_7_)
                    != &local_568.field_2) {
                  operator_delete((undefined1 *)
                                  CONCAT17(local_568._M_dataplus._M_p._7_1_,
                                           local_568._M_dataplus._M_p._0_7_),
                                  CONCAT35(local_568.field_2._M_allocated_capacity._5_3_,
                                           local_568.field_2._M_allocated_capacity._0_5_) + 1);
                }
                p_Var26 = (_Base_ptr)local_590._24_8_;
                if (err != (string *)0x0) {
                  ::std::__cxx11::stringbuf::str();
                  plVar22 = (long *)::std::__cxx11::string::_M_append
                                              ((char *)&local_568,(ulong)(err->_M_dataplus)._M_p);
                  psVar1 = (size_type *)(plVar22 + 2);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*plVar22 ==
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)psVar1) {
                    local_5e8.field_2._M_allocated_capacity = *psVar1;
                    local_5e8.field_2._8_8_ = plVar22[3];
                    local_5e8._M_dataplus._M_p = (pointer)&local_5e8.field_2;
                  }
                  else {
                    local_5e8.field_2._M_allocated_capacity = *psVar1;
                    local_5e8._M_dataplus._M_p = (pointer)*plVar22;
                  }
                  local_5e8._M_string_length = plVar22[1];
                  *plVar22 = (long)psVar1;
                  plVar22[1] = 0;
                  *(undefined1 *)(plVar22 + 2) = 0;
                  ::std::__cxx11::string::operator=((string *)err,(string *)&local_5e8);
                  p_Var26 = (_Base_ptr)local_590._24_8_;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_5e8._M_dataplus._M_p != &local_5e8.field_2) {
                    operator_delete(local_5e8._M_dataplus._M_p,
                                    local_5e8.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT17(local_568._M_dataplus._M_p._7_1_,local_568._M_dataplus._M_p._0_7_)
                      != &local_568.field_2) {
                    operator_delete((undefined1 *)
                                    CONCAT17(local_568._M_dataplus._M_p._7_1_,
                                             local_568._M_dataplus._M_p._0_7_),
                                    CONCAT35(local_568.field_2._M_allocated_capacity._5_3_,
                                             local_568.field_2._M_allocated_capacity._0_5_) + 1);
                  }
                }
                ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4c0);
                ::std::ios_base::~ios_base(local_450);
                iVar17 = 1;
              }
              if ((undefined1 *)local_5a0._8_8_ != local_590 + 8) {
                operator_delete((void *)local_5a0._8_8_,local_590._8_8_ + 1);
              }
            }
            else {
              iVar17 = 0;
              if (local_5c8._0_4_ == Success) {
                bVar14 = ConvertTokenAttributeToStringAttribute
                                   ((TypedAttribute<tinyusdz::Animatable<tinyusdz::Token>_> *)
                                    local_2b0,
                                    (TypedAttribute<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)local_530);
                iVar17 = 3;
                if (!bVar14) {
                  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4c0);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_4c0,"[error]",7);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_4c0,
                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                             ,0x5a);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c0,":",1);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_4c0,"ReconstructShader",0x11);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c0,"():",3)
                  ;
                  poVar19 = (ostream *)::std::ostream::operator<<((ostringstream *)local_4c0,0x1169)
                  ;
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar19," ",1);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_4c0,
                             "Failed to convert inputs:varname token type to string type.",0x3b);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c0,"\n",1);
                  if (err != (string *)0x0) {
                    ::std::__cxx11::stringbuf::str();
                    plVar22 = (long *)::std::__cxx11::string::_M_append
                                                ((char *)&local_5e8,(ulong)(err->_M_dataplus)._M_p);
                    pbVar25 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (plVar22 + 2);
                    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        *plVar22 == pbVar25) {
                      local_590._0_8_ = (pbVar25->_M_dataplus)._M_p;
                      local_590._8_8_ = plVar22[3];
                      local_5a0._0_8_ =
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_590;
                    }
                    else {
                      local_590._0_8_ = (pbVar25->_M_dataplus)._M_p;
                      local_5a0._0_8_ =
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           *plVar22;
                    }
                    local_5a0._8_8_ = plVar22[1];
                    *plVar22 = (long)pbVar25;
                    plVar22[1] = 0;
                    *(undefined1 *)(plVar22 + 2) = 0;
                    ::std::__cxx11::string::operator=((string *)err,(string *)local_5a0);
                    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_5a0._0_8_ !=
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_590) {
                      operator_delete((void *)local_5a0._0_8_,(ulong)(local_590._0_8_ + 1));
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_5e8._M_dataplus._M_p != &local_5e8.field_2) {
                      operator_delete(local_5e8._M_dataplus._M_p,
                                      local_5e8.field_2._M_allocated_capacity + 1);
                    }
                  }
                  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4c0);
                  ::std::ios_base::~ios_base(local_450);
                  iVar17 = 1;
                }
              }
            }
            if (local_5c0._M_p != local_5b8 + 8) {
              operator_delete(local_5c0._M_p,local_5b8._8_8_ + 1);
            }
            if (auStack_98[0x10] == '\x01') {
              nonstd::optional_lite::detail::storage_t<tinyusdz::Animatable<tinyusdz::Token>_>::
              destruct_value(local_80);
            }
            ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector
                      ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)(local_c8 + 0x28))
            ;
            AttrMetas::~AttrMetas((AttrMetas *)local_2b0);
            if (iVar17 != 0) goto LAB_0023db7d;
          }
        }
        local_330._16_8_ = local_310;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)(local_330 + 0x10),*(long *)(p_Var24 + 1),
                   (long)&(p_Var24[1]._M_parent)->_M_color + *(long *)(p_Var24 + 1));
        local_568._M_dataplus._M_p._0_7_ = SUB87(&local_568.field_2,0);
        local_568._M_dataplus._M_p._7_1_ = (undefined1)((ulong)&local_568.field_2 >> 0x38);
        ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_568,"outputs:result","");
        uVar3 = local_330._24_8_;
        lVar28 = (long)&local_4b0 + 8;
        local_4b8 = (undefined4)lVar28;
        acStack_4b4._0_2_ = (undefined2)((ulong)lVar28 >> 0x20);
        acStack_4b4._2_2_ = (undefined2)((ulong)lVar28 >> 0x30);
        local_4b0._M_allocated_capacity = 0;
        local_4b0._8_4_ = local_4b0._8_4_ & 0xffffff00;
        uVar27 = CONCAT17(local_568._M_string_length._7_1_,
                          CONCAT25(local_568._M_string_length._5_2_,
                                   (undefined5)local_568._M_string_length));
        __n_00 = local_330._24_8_;
        if (uVar27 < (ulong)local_330._24_8_) {
          __n_00 = uVar27;
        }
        if (__n_00 == 0) {
          if (local_330._24_8_ == uVar27) goto LAB_0023c76b;
LAB_0023c7a3:
          local_4c0._0_4_ = 1;
        }
        else {
          iVar17 = bcmp((void *)local_330._16_8_,
                        (void *)CONCAT17(local_568._M_dataplus._M_p._7_1_,
                                         local_568._M_dataplus._M_p._0_7_),__n_00);
          if ((uVar3 != uVar27) || (iVar17 != 0)) goto LAB_0023c7a3;
LAB_0023c76b:
          cVar21 = ::std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_500,&local_568);
          if (cVar21._M_node == &local_4f8) {
            if (*(uint *)((long)&p_Var24[0x17]._M_parent + 4) < 2) {
              bVar14 = Attribute::is_connection(&local_570->_attrib);
              if (bVar14) {
                local_4c0._0_4_ = 5;
                warn = (string *)0x38;
                ::std::__cxx11::string::_M_replace
                          ((ulong)&local_4b8,0,(char *)local_4b0._M_allocated_capacity,0x3e1315);
              }
              else {
                if (*(int *)((long)&p_Var24[0x17]._M_parent + 4) != 0) goto LAB_0023d3bb;
                Attribute::type_name_abi_cxx11_((string *)local_2b0,&local_570->_attrib);
                bVar14 = tinyusdz::value::IsRoleType((string *)local_2b0);
                local_5c8 = (undefined1  [8])local_5b8;
                local_5b8._0_8_ = (char *)0x6633726f74636576;
                local_5c0._M_p = (pointer)0x8;
                local_5b8._8_8_ = local_5b8._8_8_ & 0xffffffffffffff00;
                lVar28 = CONCAT26(local_2b0._14_2_,CONCAT24(local_2b0._12_2_,local_2b0._8_4_));
                if (lVar28 == 8) {
                  if (*(size_type *)local_2b0._0_8_ == 0x6633726f74636576) {
                    (local_548->result)._authored = true;
                    AttrMetas::operator=(local_538,(AttrMetas *)(p_Var24 + 7));
                    ::std::
                    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    ::_M_insert_unique<std::__cxx11::string_const&>(local_500,&local_568);
                    local_4c0._0_4_ = 0;
                  }
                  else {
                    if (bVar14) goto LAB_0023d89b;
LAB_0023dc06:
                    local_4c0._0_4_ = 3;
                    local_5e8._M_dataplus._M_p = (pointer)0x61;
                    local_5a0._0_8_ = local_590;
                    local_590._24_8_ = p_Var26;
                    pbVar25 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ::std::__cxx11::string::_M_create
                                        ((ulong *)local_5a0,(ulong)&local_5e8);
                    _Var5._M_p = local_5e8._M_dataplus._M_p;
                    local_590._0_8_ = local_5e8._M_dataplus._M_p;
                    local_5a0._0_8_ = pbVar25;
                    memcpy(pbVar25,
                           "Attribute type mismatch. {} expects type `{}`(and its underlying types) but defined as type `{}`."
                           ,0x61);
                    local_5a0._8_8_ = _Var5._M_p;
                    _Var5._M_p[(long)&pbVar25->_M_dataplus] = '\0';
                    local_5e8._M_dataplus._M_p = (pointer)&local_5e8.field_2;
                    local_5e8.field_2._M_allocated_capacity = 0x6633726f74636576;
                    local_5e8._M_string_length = 8;
                    local_5e8.field_2._8_8_ = local_5e8.field_2._8_8_ & 0xffffffffffffff00;
                    warn = (string *)local_2b0;
                    fmt::format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                              ((string *)local_5c8,(fmt *)local_5a0,&local_568,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &local_5e8,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_2b0,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               args_2);
                    ::std::__cxx11::string::operator=((string *)&local_4b8,(string *)local_5c8);
                    if (local_5c8 != (undefined1  [8])local_5b8) {
                      operator_delete((void *)local_5c8,(ulong)(local_5b8._0_8_ + 1));
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_5e8._M_dataplus._M_p != &local_5e8.field_2) {
                      operator_delete(local_5e8._M_dataplus._M_p,
                                      local_5e8.field_2._M_allocated_capacity + 1);
                    }
                    bVar14 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_5a0._0_8_ ==
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_590;
LAB_0023dd07:
                    p_Var26 = (_Base_ptr)local_590._24_8_;
                    if (!bVar14) {
                      operator_delete((void *)local_5a0._0_8_,(ulong)(local_590._0_8_ + 1));
                    }
                  }
                }
                else {
                  if (bVar14) {
LAB_0023d89b:
                    local_4c0._0_4_ = 3;
                    local_5e8._M_dataplus._M_p = (pointer)0x47;
                    local_5a0._0_8_ = local_590;
                    local_590._24_8_ = p_Var26;
                    pbVar25 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ::std::__cxx11::string::_M_create
                                        ((ulong *)local_5a0,(ulong)&local_5e8);
                    _Var5._M_p = local_5e8._M_dataplus._M_p;
                    local_590._0_8_ = local_5e8._M_dataplus._M_p;
                    local_5a0._0_8_ = pbVar25;
                    memcpy(pbVar25,
                           "Attribute type mismatch. {} expects type `{}` but defined as type `{}`."
                           ,0x47);
                    local_5a0._8_8_ = _Var5._M_p;
                    _Var5._M_p[(long)&pbVar25->_M_dataplus] = '\0';
                    local_5e8._M_dataplus._M_p = (pointer)&local_5e8.field_2;
                    local_5e8.field_2._M_allocated_capacity = 0x6633726f74636576;
                    local_5e8._M_string_length = 8;
                    local_5e8.field_2._8_8_ = local_5e8.field_2._8_8_ & 0xffffffffffffff00;
                    warn = (string *)local_2b0;
                    fmt::format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                              ((string *)local_5c8,(fmt *)local_5a0,&local_568,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &local_5e8,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_2b0,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               args_2);
                    ::std::__cxx11::string::operator=((string *)&local_4b8,(string *)local_5c8);
                    if (local_5c8 != (undefined1  [8])local_5b8) {
                      operator_delete((void *)local_5c8,(ulong)(local_5b8._0_8_ + 1));
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_5e8._M_dataplus._M_p != &local_5e8.field_2) {
                      operator_delete(local_5e8._M_dataplus._M_p,
                                      local_5e8.field_2._M_allocated_capacity + 1);
                    }
                    bVar14 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_5a0._0_8_ ==
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_590;
                    goto LAB_0023dd07;
                  }
                  local_5c0._M_p = (pointer)0x6;
                  local_5b8._0_8_ = (char *)0x66003374616f6c66;
                  if ((lVar28 != 6) ||
                     ((short)*(int *)(local_2b0._0_8_ + 4) != 0x3374 ||
                      *(int *)local_2b0._0_8_ != 0x616f6c66)) goto LAB_0023dc06;
                  (local_548->result)._authored = true;
                  local_590._24_8_ = p_Var26;
                  ::std::__cxx11::string::_M_assign((string *)local_450._264_8_);
                  AttrMetas::operator=(local_538,(AttrMetas *)(p_Var24 + 7));
                  ::std::
                  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  ::_M_insert_unique<std::__cxx11::string_const&>(local_500,&local_568);
                  local_4c0._0_4_ = 0;
                  p_Var26 = (_Base_ptr)local_590._24_8_;
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_2b0._0_8_ != &local_2a0) {
                  operator_delete((void *)local_2b0._0_8_,
                                  CONCAT26(local_2a0._M_allocated_capacity._6_2_,
                                           CONCAT42(local_2a0._M_allocated_capacity._2_4_,
                                                    local_2a0._M_allocated_capacity._0_2_)) + 1);
                }
              }
            }
            else {
LAB_0023d3bb:
              warn = (string *)&DAT_00000041;
              ::std::__cxx11::string::_M_replace
                        ((ulong)&local_4b8,0,(char *)local_4b0._M_allocated_capacity,0x3e134e);
              local_4c0._0_4_ = 6;
            }
          }
          else {
            local_4c0._0_4_ = 2;
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT17(local_568._M_dataplus._M_p._7_1_,local_568._M_dataplus._M_p._0_7_) !=
            &local_568.field_2) {
          operator_delete((undefined1 *)
                          CONCAT17(local_568._M_dataplus._M_p._7_1_,local_568._M_dataplus._M_p._0_7_
                                  ),
                          CONCAT35(local_568.field_2._M_allocated_capacity._5_3_,
                                   local_568.field_2._M_allocated_capacity._0_5_) + 1);
        }
        if ((long *)local_330._16_8_ != local_310) {
          operator_delete((void *)local_330._16_8_,local_310[0] + 1);
        }
        iVar17 = 0;
        if ((local_4c0._0_4_ & 0xfffffffd) == 0) {
          iVar17 = 3;
LAB_0023ce42:
          bVar14 = false;
        }
        else {
          bVar14 = true;
          if (local_4c0._0_4_ != 1) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2b0);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_2b0,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                       ,0x5a);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_2b0,"ReconstructShader",0x11);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,"():",3);
            poVar19 = (ostream *)::std::ostream::operator<<((Property *)local_2b0,0x1181);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar19," ",1);
            local_5a0._0_8_ =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_590;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_5a0,"Parsing shader output property `{}` failed. Error: {}",
                       "");
            fmt::format<char[15],std::__cxx11::string>
                      ((string *)local_5c8,(fmt *)local_5a0,(string *)"outputs:result",
                       (char (*) [15])&local_4b8,warn);
            poVar19 = ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_2b0,(char *)local_5c8,(long)local_5c0._M_p);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar19,"\n",1);
            if (local_5c8 != (undefined1  [8])local_5b8) {
              operator_delete((void *)local_5c8,(ulong)(local_5b8._0_8_ + 1));
            }
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5a0._0_8_
                != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_590) {
              operator_delete((void *)local_5a0._0_8_,(ulong)(local_590._0_8_ + 1));
            }
            if (err != (string *)0x0) {
              ::std::__cxx11::stringbuf::str();
              plVar20 = (long *)::std::__cxx11::string::_M_append
                                          (local_5a0,(ulong)(err->_M_dataplus)._M_p);
              plVar22 = plVar20 + 2;
              if ((long *)*plVar20 == plVar22) {
                local_5b8._0_8_ = *plVar22;
                local_5b8._8_8_ = plVar20[3];
                local_5c8 = (undefined1  [8])local_5b8;
              }
              else {
                local_5b8._0_8_ = *plVar22;
                local_5c8 = (undefined1  [8])*plVar20;
              }
              local_5c0._M_p = (pointer)plVar20[1];
              *plVar20 = (long)plVar22;
              plVar20[1] = 0;
              *(undefined1 *)(plVar20 + 2) = 0;
              ::std::__cxx11::string::operator=((string *)err,(string *)local_5c8);
              if (local_5c8 != (undefined1  [8])local_5b8) {
                operator_delete((void *)local_5c8,(ulong)(local_5b8._0_8_ + 1));
              }
              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_5a0._0_8_ !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_590) {
                operator_delete((void *)local_5a0._0_8_,(ulong)(local_590._0_8_ + 1));
              }
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2b0);
            ::std::ios_base::~ios_base((ios_base *)&pSStack_240);
            iVar17 = 1;
            goto LAB_0023ce42;
          }
        }
        pcVar18 = (char *)CONCAT26(acStack_4b4._2_2_,CONCAT24(acStack_4b4._0_2_,local_4b8));
        if (pcVar18 != local_4b0._M_local_buf + 8) {
          operator_delete(pcVar18,CONCAT44(local_4b0._12_4_,local_4b0._8_4_) + 1);
        }
        if (!bVar14) goto LAB_0023db7d;
        cVar21 = ::std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_500,(key_type *)p_Var26);
        if (cVar21._M_node == &local_4f8) {
          pmVar23 = ::std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                    ::operator[](local_338,(key_type *)p_Var26);
          ::std::__cxx11::string::_M_assign((string *)pmVar23);
          (pmVar23->_attrib)._varying_authored = (bool)p_Var24[3].field_0x4;
          (pmVar23->_attrib)._variability = p_Var24[3]._M_color;
          ::std::__cxx11::string::_M_assign((string *)&(pmVar23->_attrib)._type_name);
          linb::any::operator=((any *)&(pmVar23->_attrib)._var,(any *)&p_Var24[4]._M_parent);
          (pmVar23->_attrib)._var._blocked = SUB41(p_Var24[5]._M_color,0);
          ::std::
          vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
          ::operator=(&(pmVar23->_attrib)._var._ts._samples,
                      (vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                       *)&p_Var24[5]._M_parent);
          (pmVar23->_attrib)._var._ts._dirty = SUB41(p_Var24[6]._M_color,0);
          std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                    ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                     &(pmVar23->_attrib)._paths,
                     (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                     &p_Var24[6]._M_parent);
          AttrMetas::operator=(&(pmVar23->_attrib)._metas,(AttrMetas *)(p_Var24 + 7));
          *(_Base_ptr *)&pmVar23->_listOpQual = p_Var24[0x17]._M_parent;
          (pmVar23->_rel).type = *(Type *)&p_Var24[0x17]._M_left;
          Path::operator=(&(pmVar23->_rel).targetPath,(Path *)&p_Var24[0x17]._M_right);
          std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                    ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                     &(pmVar23->_rel).targetPathVector,
                     (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                     &p_Var24[0x1e]._M_parent);
          (pmVar23->_rel).listOpQual = p_Var24[0x1f]._M_color;
          AttrMetas::operator=(&(pmVar23->_rel)._metas,(AttrMetas *)&p_Var24[0x1f]._M_parent);
          (pmVar23->_rel)._varying_authored = *(bool *)&p_Var24[0x2f]._M_left;
          ::std::__cxx11::string::_M_assign((string *)&pmVar23->_prop_value_type_name);
          pmVar23->_has_custom = *(bool *)&p_Var24[0x30]._M_right;
          ::std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    (local_500,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)p_Var26);
        }
        cVar21 = ::std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_500,(key_type *)p_Var26);
        if (cVar21._M_node == &local_4f8) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2b0);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,"[warn]",6);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_2b0,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                     ,0x5a);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_2b0,"ReconstructShader",0x11);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,"():",3);
          poVar19 = (ostream *)::std::ostream::operator<<((Property *)local_2b0,0x1183);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar19," ",1);
          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_4c0,"Unsupported/unimplemented property: ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           p_Var26);
          poVar19 = ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_2b0,
                               (char *)CONCAT26(local_4c0._6_2_,
                                                CONCAT24(local_4c0._4_2_,local_4c0._0_4_)),
                               CONCAT26(acStack_4b4._2_2_,CONCAT24(acStack_4b4._0_2_,local_4b8)));
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar19,"\n",1);
          paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)CONCAT26(local_4c0._6_2_,CONCAT24(local_4c0._4_2_,local_4c0._0_4_));
          if (paVar2 != &local_4b0) {
            operator_delete(paVar2,(ulong)(local_4b0._M_allocated_capacity + 1));
          }
          if (local_528 != (string *)0x0) {
            ::std::__cxx11::stringbuf::str();
            plVar20 = (long *)::std::__cxx11::string::_M_append
                                        (local_5c8,(ulong)(err->_M_dataplus)._M_p);
            local_4c0._0_4_ = SUB84(&local_4b0,0);
            local_4c0._4_2_ = (undefined2)((ulong)&local_4b0 >> 0x20);
            local_4c0._6_2_ = (undefined2)((ulong)&local_4b0 >> 0x30);
            lVar28 = *plVar20;
            plVar22 = plVar20 + 2;
            if ((long *)lVar28 == plVar22) {
              local_4b0._M_allocated_capacity = *plVar22;
              local_4b0._8_4_ = (undefined4)plVar20[3];
              local_4b0._12_4_ = (undefined4)((ulong)plVar20[3] >> 0x20);
            }
            else {
              local_4c0._0_4_ = (undefined4)lVar28;
              local_4c0._4_2_ = (undefined2)((ulong)lVar28 >> 0x20);
              local_4c0._6_2_ = (undefined2)((ulong)lVar28 >> 0x30);
              local_4b0._M_allocated_capacity = *plVar22;
            }
            lVar28 = plVar20[1];
            local_4b8 = (undefined4)lVar28;
            acStack_4b4._0_2_ = (undefined2)((ulong)lVar28 >> 0x20);
            acStack_4b4._2_2_ = (undefined2)((ulong)lVar28 >> 0x30);
            *plVar20 = (long)plVar22;
            plVar20[1] = 0;
            *(undefined1 *)(plVar20 + 2) = 0;
            ::std::__cxx11::string::operator=((string *)local_528,(string *)local_4c0);
            paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)CONCAT26(local_4c0._6_2_,CONCAT24(local_4c0._4_2_,local_4c0._0_4_));
            if (paVar2 != &local_4b0) {
              operator_delete(paVar2,(ulong)(local_4b0._M_allocated_capacity + 1));
            }
            if (local_5c8 != (undefined1  [8])local_5b8) {
              operator_delete((void *)local_5c8,(ulong)(local_5b8._0_8_ + 1));
            }
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2b0);
          ::std::ios_base::~ios_base((ios_base *)&pSStack_240);
        }
      }
      else {
LAB_0023db7d:
        if ((iVar17 != 3) && (iVar17 != 0)) {
          bVar14 = false;
          goto LAB_0023ddfd;
        }
      }
      p_Var24 = (_Base_ptr)::std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var24);
    } while (p_Var24 != (_Base_ptr)local_330._8_8_);
    bVar14 = true;
  }
LAB_0023ddfd:
  ::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_500,(_Link_type)local_4f8._M_parent);
  return bVar14;
}

Assistant:

bool ReconstructShader<UsdPrimvarReader_vector>(
    const Specifier &spec,
    const PropertyMap &properties,
    const ReferenceList &references,
    UsdPrimvarReader_vector *preader,
    std::string *warn,
    std::string *err,
    const PrimReconstructOptions &options)
{
  (void)spec;
  (void)references;
  (void)options;
  std::set<std::string> table;
  table.insert("info:id"); // `info:id` is already parsed in ReconstructPrim<Shader>

  for (auto &prop : properties) {
    PARSE_TYPED_ATTRIBUTE(table, prop, "inputs:fallback", UsdPrimvarReader_vector,
                   preader->fallback)
    if ((prop.first == kInputsVarname) && !table.count(kInputsVarname)) {
      // Support older spec: `token` for varname
      TypedAttribute<Animatable<value::token>> tok_attr;
      auto ret = ParseTypedAttribute(table, prop.first, prop.second, kInputsVarname, tok_attr);
      if (ret.code == ParseResult::ResultCode::Success) {
        if (!ConvertTokenAttributeToStringAttribute(tok_attr, preader->varname)) {
          PUSH_ERROR_AND_RETURN("Failed to convert inputs:varname token type to string type.");
        }
        DCOUT("`token` attribute is converted to `string` attribute.");
        continue;
      } else if (ret.code == ParseResult::ResultCode::TypeMismatch) {
        //TypedAttribute<Animatable<value::StringData>> sdata_attr;
        //auto sdret = ParseTypedAttribute(table, prop.first, prop.second, "inputs:varname", sdata_attr);
        //if (sdret.code == ParseResult::ResultCode::Success) {
        //  if (!ConvertStringDataAttributeToStringAttribute(sdata_attr, preader->varname)) {
        //    PUSH_ERROR_AND_RETURN("Failed to convert inputs:varname StringData type to string type.");
        //  }
        //} else if (sdret.code == ParseResult::ResultCode::TypeMismatch) {
          auto sret = ParseTypedAttribute(table, prop.first, prop.second, "inputs:varname", preader->varname);
          if (sret.code == ParseResult::ResultCode::Success) {
            DCOUT("Parsed string typed inputs:varname.");
            // ok
            continue;
          } else {
            PUSH_ERROR_AND_RETURN(fmt::format("Faied to parse inputs:varname: {}", sret.err));
          }
        //}
      }
    }
    PARSE_SHADER_TERMINAL_ATTRIBUTE(table, prop, "outputs:result",
                                  UsdPrimvarReader_vector, preader->result)
    ADD_PROPERTY(table, prop, UsdPrimvarReader_vector, preader->props)
    PARSE_PROPERTY_END_MAKE_WARN(table, prop)
  }
  return true;
}